

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O2

int wait_for_edge(uint user_gpio,uint edge,double timeout)

{
  uint id;
  int iVar1;
  double dVar2;
  int triggered;
  int local_1c;
  double local_18;
  
  local_1c = 0;
  iVar1 = 0;
  if (0.0 < timeout) {
    local_18 = timeout;
    dVar2 = time_time();
    local_18 = dVar2 + local_18;
    id = callback_ex(user_gpio,edge,_wfe,&local_1c);
    while (local_1c == 0) {
      dVar2 = time_time();
      if (local_18 <= dVar2) break;
      time_sleep(0.1);
    }
    callback_cancel(id);
    iVar1 = local_1c;
  }
  return iVar1;
}

Assistant:

int wait_for_edge(unsigned user_gpio, unsigned edge, double timeout)
{
   int triggered = 0;
   int id;
   double due;

   if (timeout <= 0.0) return 0;

   due = time_time() + timeout;

   id = callback_ex(user_gpio, edge, _wfe, &triggered);

   while (!triggered && (time_time() < due)) time_sleep(0.1);

   callback_cancel(id);

   return triggered;
}